

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

string * pybind11::detail::error_string_abi_cxx11_(void)

{
  undefined8 *puVar1;
  key_type **pppcVar2;
  ulong uVar3;
  uint __val;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  detail *this;
  char *pcVar8;
  long *plVar9;
  undefined8 *puVar10;
  long *plVar11;
  ulong *puVar12;
  ulong uVar13;
  PyObject *pPVar14;
  handle *handle;
  handle *handle_00;
  uint __len;
  string *in_RDI;
  undefined8 uVar15;
  PyTypeObject *pPVar16;
  size_type __dnew;
  error_scope scope;
  string __str;
  handle local_1a8;
  size_type local_1a0;
  PyObject local_198;
  string local_188;
  accessor<pybind11::detail::accessor_policies::str_attr> local_168;
  ulong *local_148;
  long local_140;
  ulong local_138;
  long lStack_130;
  undefined8 *local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  ulong *local_108;
  handle *local_100;
  ulong local_f8;
  long lStack_f0;
  error_scope local_e8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  string *local_b0;
  PyObject *local_a8;
  size_type local_a0;
  PyObject local_98;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  PyObject *local_68;
  size_type local_60;
  PyObject local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  lVar7 = PyErr_Occurred();
  if (lVar7 == 0) {
    PyErr_SetString(_PyExc_RuntimeError,"Unknown internal error occurred");
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    local_188._M_dataplus._M_p = (pointer)0x1f;
    pcVar8 = (char *)std::__cxx11::string::_M_create((ulong *)in_RDI,(ulong)&local_188);
    (in_RDI->_M_dataplus)._M_p = pcVar8;
    (in_RDI->field_2)._M_allocated_capacity = (size_type)local_188._M_dataplus._M_p;
    builtin_strncpy(pcVar8,"Unknown internal error occurred",0x1f);
    in_RDI->_M_string_length = (size_type)local_188._M_dataplus._M_p;
    local_188._M_dataplus._M_p[(long)(in_RDI->_M_dataplus)._M_p] = '\0';
  }
  else {
    PyErr_Fetch(&local_e8,&local_e8.value,&local_e8.trace);
    local_48 = &in_RDI->field_2;
    (in_RDI->_M_dataplus)._M_p = (pointer)local_48;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
    local_b0 = in_RDI;
    if (local_e8.type != (PyObject *)0x0) {
      local_168.obj.m_ptr = local_e8.type;
      local_168.key = "__name__";
      local_168.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      this = (detail *)
             accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(&local_168);
      load_type<std::__cxx11::string>
                ((make_caster<std::__cxx11::basic_string<char>_> *)&local_188,this,handle);
      local_1a8.m_ptr = (PyObject *)local_188._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p == &local_188.field_2) {
        local_198.ob_type = (PyTypeObject *)local_188.field_2._8_8_;
        local_1a8.m_ptr = &local_198;
      }
      local_198.ob_refcnt = local_188.field_2._M_allocated_capacity;
      local_1a0 = local_188._M_string_length;
      std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_1a8.m_ptr);
      if (local_1a8.m_ptr != &local_198) {
        operator_delete(local_1a8.m_ptr);
      }
      object::~object(&local_168.cache);
      std::__cxx11::string::append((char *)in_RDI);
    }
    if (local_e8.value != (PyObject *)0x0) {
      local_1a8.m_ptr = (PyObject *)PyObject_Str();
      str::operator_cast_to_string(&local_188,(str *)&local_1a8);
      std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_188._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p);
      }
      object::~object((object *)&local_1a8);
    }
    PyErr_NormalizeException(&local_e8,&local_e8.value,&local_e8.trace);
    if ((local_e8.trace != (PyObject *)0x0) &&
       (PyException_SetTraceback(local_e8.value), local_e8.trace != (PyObject *)0x0)) {
      do {
        pPVar14 = local_e8.trace;
        local_e8.trace = (PyObject *)pPVar14[1].ob_refcnt;
      } while (local_e8.trace != (PyObject *)0x0);
      pPVar16 = pPVar14[1].ob_type;
      std::__cxx11::string::append((char *)in_RDI);
      if (pPVar16 != (PyTypeObject *)0x0) {
        do {
          uVar5 = PyFrame_GetLineNumber(pPVar16);
          local_38 = *(undefined8 *)(pPVar16->tp_basicsize + 0x68);
          load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)&local_188,
                     (detail *)&local_38,handle_00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p == &local_188.field_2) {
            local_98.ob_type = (PyTypeObject *)local_188.field_2._8_8_;
            local_a8 = &local_98;
          }
          else {
            local_a8 = (PyObject *)local_188._M_dataplus._M_p;
          }
          local_a0 = local_188._M_string_length;
          plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x122ff5);
          plVar11 = plVar9 + 2;
          if ((long *)*plVar9 == plVar11) {
            local_78 = *plVar11;
            lStack_70 = plVar9[3];
            local_88 = &local_78;
          }
          else {
            local_78 = *plVar11;
            local_88 = (long *)*plVar9;
          }
          local_80 = plVar9[1];
          *plVar9 = (long)plVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_88);
          puVar12 = (ulong *)(plVar9 + 2);
          if ((ulong *)*plVar9 == puVar12) {
            local_138 = *puVar12;
            lStack_130 = plVar9[3];
            local_148 = &local_138;
          }
          else {
            local_138 = *puVar12;
            local_148 = (ulong *)*plVar9;
          }
          local_140 = plVar9[1];
          *plVar9 = (long)puVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          __val = -uVar5;
          if (0 < (int)uVar5) {
            __val = uVar5;
          }
          __len = 1;
          if (9 < __val) {
            uVar13 = (ulong)__val;
            uVar4 = 4;
            do {
              __len = uVar4;
              uVar6 = (uint)uVar13;
              if (uVar6 < 100) {
                __len = __len - 2;
                goto LAB_0010a38f;
              }
              if (uVar6 < 1000) {
                __len = __len - 1;
                goto LAB_0010a38f;
              }
              if (uVar6 < 10000) goto LAB_0010a38f;
              uVar13 = uVar13 / 10000;
              uVar4 = __len + 4;
            } while (99999 < uVar6);
            __len = __len + 1;
          }
LAB_0010a38f:
          local_d0 = local_c0;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_d0,(char)__len - (char)((int)uVar5 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uVar5 >> 0x1f) + (long)local_d0),__len,__val);
          in_RDI = local_b0;
          uVar13 = 0xf;
          if (local_148 != &local_138) {
            uVar13 = local_138;
          }
          if (uVar13 < (ulong)(local_c8 + local_140)) {
            uVar13 = 0xf;
            if (local_d0 != local_c0) {
              uVar13 = local_c0[0];
            }
            if (uVar13 < (ulong)(local_c8 + local_140)) goto LAB_0010a43d;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_148)
            ;
          }
          else {
LAB_0010a43d:
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_d0);
          }
          local_128 = &local_118;
          puVar1 = puVar10 + 2;
          if ((undefined8 *)*puVar10 == puVar1) {
            local_118 = *puVar1;
            uStack_110 = puVar10[3];
          }
          else {
            local_118 = *puVar1;
            local_128 = (undefined8 *)*puVar10;
          }
          local_120 = puVar10[1];
          *puVar10 = puVar1;
          puVar10[1] = 0;
          *(undefined1 *)puVar1 = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_128);
          local_108 = &local_f8;
          puVar12 = (ulong *)(plVar9 + 2);
          if ((ulong *)*plVar9 == puVar12) {
            local_f8 = *puVar12;
            lStack_f0 = plVar9[3];
          }
          else {
            local_f8 = *puVar12;
            local_108 = (ulong *)*plVar9;
          }
          local_100 = (handle *)plVar9[1];
          *plVar9 = (long)puVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          local_40 = *(undefined8 *)(pPVar16->tp_basicsize + 0x70);
          load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)&local_188,
                     (detail *)&local_40,local_100);
          local_68 = (PyObject *)local_188._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p == &local_188.field_2) {
            local_58.ob_type = (PyTypeObject *)local_188.field_2._8_8_;
            local_68 = &local_58;
          }
          local_60 = local_188._M_string_length;
          uVar13 = 0xf;
          if (local_108 != &local_f8) {
            uVar13 = local_f8;
          }
          uVar3 = (long)&local_100->m_ptr + local_188._M_string_length;
          if (uVar13 < uVar3) {
            uVar15 = 0xf;
            if (local_68 != &local_58) {
              uVar15 = local_188.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar15 < uVar3) goto LAB_0010a5ca;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_108)
            ;
          }
          else {
LAB_0010a5ca:
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_68);
          }
          local_168._0_8_ = &local_168.key;
          pppcVar2 = (key_type **)(puVar10 + 2);
          if ((key_type **)*puVar10 == pppcVar2) {
            local_168.key = (key_type)*pppcVar2;
            local_168.cache.super_handle.m_ptr = (handle)puVar10[3];
          }
          else {
            local_168.key = (key_type)*pppcVar2;
            local_168._0_8_ = (key_type **)*puVar10;
          }
          local_168.obj.m_ptr = (PyObject *)puVar10[1];
          *puVar10 = pppcVar2;
          puVar10[1] = 0;
          *(undefined1 *)pppcVar2 = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_168);
          local_1a8.m_ptr = &local_198;
          pPVar14 = (PyObject *)(plVar9 + 2);
          if ((PyObject *)*plVar9 == pPVar14) {
            local_198.ob_refcnt = pPVar14->ob_refcnt;
            local_198.ob_type = (PyTypeObject *)plVar9[3];
          }
          else {
            local_198.ob_refcnt = pPVar14->ob_refcnt;
            local_1a8.m_ptr = (PyObject *)*plVar9;
          }
          local_1a0 = plVar9[1];
          *plVar9 = (long)pPVar14;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_1a8.m_ptr);
          if (local_1a8.m_ptr != &local_198) {
            operator_delete(local_1a8.m_ptr);
          }
          if ((key_type *)local_168._0_8_ != &local_168.key) {
            operator_delete((void *)local_168._0_8_);
          }
          if (local_68 != &local_58) {
            operator_delete(local_68);
          }
          if (local_108 != &local_f8) {
            operator_delete(local_108);
          }
          if (local_128 != &local_118) {
            operator_delete(local_128);
          }
          if (local_d0 != local_c0) {
            operator_delete(local_d0);
          }
          if (local_148 != &local_138) {
            operator_delete(local_148);
          }
          if (local_88 != &local_78) {
            operator_delete(local_88);
          }
          if (local_a8 != &local_98) {
            operator_delete(local_a8);
          }
          pPVar16 = (PyTypeObject *)pPVar16->tp_name;
        } while (pPVar16 != (PyTypeObject *)0x0);
      }
    }
    error_scope::~error_scope(&local_e8);
  }
  return in_RDI;
}

Assistant:

PYBIND11_NOINLINE inline std::string error_string() {
    if (!PyErr_Occurred()) {
        PyErr_SetString(PyExc_RuntimeError, "Unknown internal error occurred");
        return "Unknown internal error occurred";
    }

    error_scope scope; // Preserve error state

    std::string errorString;
    if (scope.type) {
        errorString += handle(scope.type).attr("__name__").cast<std::string>();
        errorString += ": ";
    }
    if (scope.value)
        errorString += (std::string) str(scope.value);

    PyErr_NormalizeException(&scope.type, &scope.value, &scope.trace);

#if PY_MAJOR_VERSION >= 3
    if (scope.trace != nullptr)
        PyException_SetTraceback(scope.value, scope.trace);
#endif

#if !defined(PYPY_VERSION)
    if (scope.trace) {
        PyTracebackObject *trace = (PyTracebackObject *) scope.trace;

        /* Get the deepest trace possible */
        while (trace->tb_next)
            trace = trace->tb_next;

        PyFrameObject *frame = trace->tb_frame;
        errorString += "\n\nAt:\n";
        while (frame) {
            int lineno = PyFrame_GetLineNumber(frame);
            errorString +=
                "  " + handle(frame->f_code->co_filename).cast<std::string>() +
                "(" + std::to_string(lineno) + "): " +
                handle(frame->f_code->co_name).cast<std::string>() + "\n";
            frame = frame->f_back;
        }
    }
#endif

    return errorString;
}